

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O2

bool cmGetTestPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *testName;
  cmMakefile *this;
  pointer pbVar1;
  cmTest *this_00;
  cmValue cVar2;
  size_t sVar3;
  char *__s;
  ulong uVar4;
  string_view value;
  allocator<char> local_41;
  string local_40 [32];
  
  testName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)testName;
  if (uVar4 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"called with incorrect number of arguments",&local_41);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string(local_40);
    goto LAB_001d0282;
  }
  this = status->Makefile;
  this_00 = cmMakefile::GetTest(this,testName);
  if ((this_00 == (cmTest *)0x0) ||
     (pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start, pbVar1[1]._M_string_length == 0)) {
LAB_001d026d:
    __s = "NOTFOUND";
    sVar3 = 8;
  }
  else {
    cVar2 = cmTest::GetProperty(this_00,pbVar1 + 1);
    if (cVar2.Value == (string *)0x0) goto LAB_001d026d;
    __s = ((cVar2.Value)->_M_dataplus)._M_p;
    sVar3 = strlen(__s);
  }
  value._M_str = __s;
  value._M_len = sVar3;
  cmMakefile::AddDefinition(this,testName + 2,value);
LAB_001d0282:
  return 0x40 < uVar4;
}

Assistant:

bool cmGetTestPropertyCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& testName = args[0];
  std::string const& var = args[2];
  cmMakefile& mf = status.GetMakefile();
  cmTest* test = mf.GetTest(testName);
  if (test) {
    cmValue prop;
    if (!args[1].empty()) {
      prop = test->GetProperty(args[1]);
    }
    if (prop) {
      mf.AddDefinition(var, prop->c_str());
      return true;
    }
  }
  mf.AddDefinition(var, "NOTFOUND");
  return true;
}